

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLs_AccessLMem(void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKLsMem *arkls_mem)

{
  ARKLsMem pAVar1;
  int error_code;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    ark_mem_00 = (ARKodeMem)0x0;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    pAVar1 = (ARKLsMem)(**(code **)((long)arkode_mem + 0xa8))();
    if (pAVar1 != (ARKLsMem)0x0) {
      *arkls_mem = pAVar1;
      return 0;
    }
    ark_mem_00 = *ark_mem;
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
  }
  arkProcessError(ark_mem_00,error_code,"ARKLS",fname,msgfmt);
  return error_code;
}

Assistant:

int arkLs_AccessLMem(void* arkode_mem, const char *fname,
                     ARKodeMem *ark_mem, ARKLsMem *arkls_mem)
{
  void* ark_step_lmem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARKLS_MEM_NULL, "ARKLS",
                    fname, MSG_LS_ARKMEM_NULL);
    return(ARKLS_MEM_NULL);
  }
  *ark_mem = (ARKodeMem) arkode_mem;
  ark_step_lmem = (*ark_mem)->step_getlinmem(arkode_mem);
  if (ark_step_lmem==NULL) {
    arkProcessError(*ark_mem, ARKLS_LMEM_NULL, "ARKLS",
                    fname, MSG_LS_LMEM_NULL);
    return(ARKLS_LMEM_NULL);
  }
  *arkls_mem = (ARKLsMem) ark_step_lmem;
  return(ARKLS_SUCCESS);
}